

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O0

void __thiscall vkb::Result<vkb::Device>::Result(Result<vkb::Device> *this,Device *value)

{
  Device *value_local;
  Result<vkb::Device> *this_local;
  
  Device::Device((Device *)this,value);
  this->m_init = true;
  return;
}

Assistant:

Result(T&& value) noexcept : m_value{ std::move(value) }, m_init{ true } {}